

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

saucy_graph *
buildSim2Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep,
              Vec_Ptr_t **topOrder,Vec_Int_t **obs,Vec_Int_t **ctrl)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *pModel;
  int *__ptr;
  int *piVar5;
  int *piVar6;
  int numins;
  int numouts;
  int *output2;
  int *output;
  int *vPiValues;
  int *edg;
  int *adj;
  int e;
  int n;
  saucy_graph *g;
  int local_48;
  int k;
  int j;
  int i;
  Vec_Ptr_t **topOrder_local;
  Vec_Int_t **oDep_local;
  Vec_Int_t **iDep_local;
  Vec_Int_t *randVec_local;
  coloring *c_local;
  Abc_Ntk_t *pNtk_local;
  
  adj._0_4_ = ABC_FUNC_NONE;
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar2 = Abc_NtkPiNum(pNtk);
  pModel = generateProperInputVector(pNtk,c,randVec);
  if (pModel == (int *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    for (k = 0; k < iVar2; k = k + 1) {
      if (c->clen[c->cfront[k + iVar1]] != 0) {
        if (pModel[k] == 0) {
          pModel[k] = 1;
        }
        else {
          pModel[k] = 0;
        }
        piVar5 = Abc_NtkSimulateOneNode(pNtk,pModel,k,topOrder);
        for (local_48 = 0; iVar3 = Vec_IntSize(iDep[k]), local_48 < iVar3; local_48 = local_48 + 1)
        {
          iVar3 = Vec_IntEntry(iDep[k],local_48);
          iVar3 = __ptr[iVar3];
          iVar4 = Vec_IntEntry(iDep[k],local_48);
          if (iVar3 != piVar5[iVar4]) {
            p = obs[k];
            iVar3 = Vec_IntEntry(iDep[k],local_48);
            Vec_IntPush(p,iVar3);
            iVar3 = Vec_IntEntry(iDep[k],local_48);
            Vec_IntPush(ctrl[iVar3],k);
            adj._0_4_ = (Abc_NtkFunc_t)adj + ABC_FUNC_SOP;
          }
        }
        if (pModel[k] == 0) {
          pModel[k] = 1;
        }
        else {
          pModel[k] = 0;
        }
        if (piVar5 != (int *)0x0) {
          free(piVar5);
        }
      }
    }
    pNtk_local = (Abc_Ntk_t *)malloc(0x18);
    piVar5 = ints(iVar1 + iVar2 + ABC_NTK_NETLIST);
    piVar6 = ints((Abc_NtkFunc_t)adj << 1);
    pNtk_local->ntkType = iVar1 + iVar2;
    pNtk_local->ntkFunc = (Abc_NtkFunc_t)adj;
    pNtk_local->pName = (char *)piVar5;
    pNtk_local->pSpec = (char *)piVar6;
    *piVar5 = 0;
    for (k = 0; k < iVar1; k = k + 1) {
      iVar3 = piVar5[k];
      iVar4 = Vec_IntSize(ctrl[k]);
      piVar5[k + 1] = iVar3 + iVar4;
      g._4_4_ = 0;
      for (local_48 = piVar5[k]; local_48 < piVar5[k + 1]; local_48 = local_48 + 1) {
        iVar3 = Vec_IntEntry(ctrl[k],g._4_4_);
        piVar6[local_48] = iVar3 + iVar1;
        g._4_4_ = g._4_4_ + 1;
      }
    }
    for (k = 0; k < iVar2; k = k + 1) {
      iVar3 = piVar5[k + iVar1];
      iVar4 = Vec_IntSize(obs[k]);
      piVar5[k + iVar1 + 1] = iVar3 + iVar4;
      g._4_4_ = 0;
      for (local_48 = piVar5[k + iVar1]; local_48 < piVar5[k + iVar1 + 1]; local_48 = local_48 + 1)
      {
        iVar3 = Vec_IntEntry(obs[k],g._4_4_);
        piVar6[local_48] = iVar3;
        g._4_4_ = g._4_4_ + 1;
      }
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (pModel != (int *)0x0) {
      free(pModel);
    }
    for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
      Vec_IntClear(obs[local_48]);
    }
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      Vec_IntClear(ctrl[local_48]);
    }
  }
  return (saucy_graph *)pNtk_local;
}

Assistant:

static struct saucy_graph *
buildSim2Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep, Vec_Ptr_t ** topOrder, Vec_Int_t ** obs,  Vec_Int_t ** ctrl )
{
    int i, j, k;
    struct saucy_graph *g = NULL;
    int n, e = 0, *adj, *edg;
    int * vPiValues;
    int * output, * output2;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);

    extern int * Abc_NtkSimulateOneNode( Abc_Ntk_t * , int * , int , Vec_Ptr_t ** );    
    
    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern( pNtk, vPiValues );   
    
    for (i = 0; i < numins; i++) {
        if (!c->clen[c->cfront[i+numouts]]) continue;
        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        output2 = Abc_NtkSimulateOneNode( pNtk, vPiValues, i, topOrder );

        for (j = 0; j < Vec_IntSize(iDep[i]); j++) {
            if (output[Vec_IntEntry(iDep[i], j)] != output2[Vec_IntEntry(iDep[i], j)]) {
                Vec_IntPush(obs[i], Vec_IntEntry(iDep[i], j));
                Vec_IntPush(ctrl[Vec_IntEntry(iDep[i], j)], i);
                e++;
            }
        }

        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        ABC_FREE( output2 );
    }       

    /* build the graph */
    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;       

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        adj[i+1] = adj[i] + Vec_IntSize(ctrl[i]);
        for (k = 0, j = adj[i]; j < adj[i+1]; j++, k++)
            edg[j] = Vec_IntEntry(ctrl[i], k) + numouts;
    }
    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts] + Vec_IntSize(obs[i]);
        for (k = 0, j = adj[i+numouts]; j < adj[i+numouts+1]; j++, k++)
            edg[j] = Vec_IntEntry(obs[i], k);
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( output );
    ABC_FREE( vPiValues );  
    for (j = 0; j < numins; j++)
        Vec_IntClear(obs[j]);
    for (j = 0; j < numouts; j++)
        Vec_IntClear(ctrl[j]);

    return g;
}